

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

int32_t uchar_swapNames_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                          UErrorCode *pErrorCode)

{
  uint32_t *__src;
  byte bVar1;
  char cVar2;
  UDataSwapFn *pUVar3;
  bool bVar4;
  uint16_t uVar5;
  int16_t iVar6;
  uint16_t tokenCount;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  void *__dest;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  byte *s;
  byte *pbVar15;
  uint16_t *puVar16;
  size_t sVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  int32_t iVar22;
  ulong uVar23;
  byte *pbVar24;
  char *pcVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  uint16_t lengths [33];
  uint16_t offsets [33];
  uint8_t trailMap [256];
  uint8_t map [256];
  int16_t tokens [512];
  uint local_740;
  uint local_734;
  uint16_t local_6d8 [31];
  ushort local_69a;
  uint16_t local_688 [31];
  ushort local_64a;
  byte local_638 [256];
  byte local_538 [256];
  int16_t local_438 [256];
  int16_t local_238 [260];
  
  iVar7 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((((*(byte *)((long)inData + 0xc) != 0x75) || (*(char *)((long)inData + 0xd) != 'n')) ||
      (*(char *)((long)inData + 0xe) != 'a')) ||
     ((*(char *)((long)inData + 0xf) != 'm' || (*(char *)((long)inData + 0x10) != '\x01')))) {
    udata_printError_63(ds,
                        "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  lVar19 = (long)iVar7;
  __src = (uint32_t *)(lVar19 + (long)inData);
  if (length < 0) {
    local_734 = (*ds->readUInt32)(__src[3]);
  }
  else {
    length = length - iVar7;
    if ((length < 0x14) || (local_734 = (*ds->readUInt32)(__src[3]), (uint)length < local_734)) {
      udata_printError_63(ds,"uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                          (ulong)(uint)length);
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
  }
  if (length < 0) {
    uVar8 = (*ds->readUInt32)(*(uint32_t *)((long)__src + (ulong)local_734));
    uVar18 = local_734 + 4;
    for (; uVar8 != 0; uVar8 = uVar8 - 1) {
      uVar5 = (*ds->readUInt16)(*(uint16_t *)((long)__src + (ulong)uVar18 + 10));
      uVar18 = uVar18 + uVar5;
    }
    goto LAB_0019f5f3;
  }
  __dest = (void *)(lVar19 + (long)outData);
  if (inData != outData) {
    memcpy(__dest,__src,(ulong)(uint)length);
  }
  uVar8 = (*ds->readUInt32)(*__src);
  uVar9 = (*ds->readUInt32)(__src[1]);
  uVar10 = (*ds->readUInt32)(__src[2]);
  (*ds->swapArray32)(ds,__src,0x10,__dest,pErrorCode);
  uVar5 = (*ds->readUInt16)((uint16_t)__src[4]);
  (*ds->swapArray16)(ds,__src + 4,2,(void *)((long)__dest + 0x10),pErrorCode);
  pvVar13 = (void *)((long)__src + 0x12);
  uVar14 = (ulong)uVar5;
  uVar18 = 0x200;
  if (uVar5 < 0x201) {
    uVar18 = (uint)uVar5;
  }
  if (uVar18 == 0) {
    uVar23 = 0;
  }
  else {
    uVar23 = 0;
    do {
      iVar6 = udata_readInt16_63(ds,*(int16_t *)((long)pvVar13 + uVar23 * 2));
      local_438[uVar23] = iVar6;
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
  }
  uVar18 = (uint)uVar23;
  if (uVar18 < 0x200) {
    memset((void *)((long)local_438 + (ulong)(uVar18 * 2)),0,(ulong)(uVar18 * -2 + 0x400));
  }
  makeTokenMap(ds,local_438,uVar5,local_538,pErrorCode);
  tokenCount = uVar5 - 0x100;
  if (uVar5 < 0x100) {
    tokenCount = 0;
  }
  makeTokenMap(ds,local_238,tokenCount,local_638,pErrorCode);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar18 = (uint)uVar5;
    pvVar12 = uprv_malloc_63((ulong)(uVar18 * 2));
    if (pvVar12 == (void *)0x0) {
      udata_printError_63(ds,"out of memory swapping %u unames.icu tokens\n",uVar14);
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_0019f56a;
    }
    if (uVar18 == 0) {
      uVar23 = 0;
    }
    else {
      uVar28 = 0x100;
      if (uVar18 < 0x100) {
        uVar28 = uVar14;
      }
      uVar23 = 0;
      do {
        (*ds->swapArray16)(ds,pvVar13,2,(void *)((long)pvVar12 + (ulong)local_538[uVar23] * 2),
                           pErrorCode);
        uVar23 = uVar23 + 1;
        pvVar13 = (void *)((long)pvVar13 + 2);
      } while (uVar28 != uVar23);
    }
    if ((uint)uVar23 < uVar18) {
      uVar23 = uVar23 & 0xffffffff;
      pvVar13 = (void *)((long)inData + lVar19 + uVar23 * 2 + 0x12);
      do {
        (*ds->swapArray16)(ds,pvVar13,2,
                           (void *)((long)pvVar12 +
                                   (ulong)local_638[uVar23 & 0xff] * 2 +
                                   (ulong)((uint)uVar23 & 0x7fffff00) * 2),pErrorCode);
        uVar23 = uVar23 + 1;
        pvVar13 = (void *)((long)pvVar13 + 2);
      } while (uVar14 != uVar23);
    }
    memcpy((void *)((long)__dest + 0x12),pvVar12,(ulong)(uVar18 * 2));
    uprv_free_63(pvVar12);
    udata_swapInvStringBlock_63
              (ds,(void *)((long)__src + (ulong)uVar8),uVar9 - uVar8,
               (void *)((ulong)uVar8 + (long)__dest),pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      udata_printError_63(ds,"uchar_swapNames(token strings) failed\n");
      goto LAB_0019f56a;
    }
    uVar14 = (ulong)uVar9;
    uVar5 = (*ds->readUInt16)(*(uint16_t *)((long)__src + uVar14));
    (*ds->swapArray16)(ds,(void *)((long)__src + uVar14),((uint)uVar5 + (uint)uVar5 * 2) * 2 + 2,
                       (void *)(uVar14 + (long)__dest),pErrorCode);
    if ((ds->inCharset != ds->outCharset) && (local_740 = local_734 - uVar10, 0x20 < local_740)) {
      pbVar24 = (byte *)((long)__dest + (ulong)uVar10);
      s = (byte *)((ulong)uVar10 + (long)__src);
      do {
        pbVar15 = icu_63::expandGroupLengths(s,local_688,local_6d8);
        lVar20 = (long)pbVar15 - (long)s;
        pbVar24 = pbVar24 + lVar20;
        s = pbVar15;
        for (iVar26 = (uint)local_69a + (uint)local_64a; iVar26 != 0; iVar26 = iVar26 + iVar27) {
          bVar1 = *s;
          *pbVar24 = local_538[bVar1];
          if (local_438[bVar1] == -2) {
            pbVar15 = s + 1;
            s = s + 2;
            pbVar24[1] = local_638[*pbVar15];
            pbVar24 = pbVar24 + 2;
            iVar27 = -2;
          }
          else {
            s = s + 1;
            pbVar24 = pbVar24 + 1;
            iVar27 = -1;
          }
        }
        local_740 = local_740 - ((uint)local_69a + (uint)local_64a + (int)lVar20);
      } while (0x20 < local_740);
    }
    uVar14 = (ulong)local_734;
    uVar8 = (*ds->readUInt32)(*(uint32_t *)((long)__src + uVar14));
    (*ds->swapArray32)(ds,(void *)((long)__src + uVar14),4,(void *)(uVar14 + (long)__dest),
                       pErrorCode);
    uVar18 = local_734 + 4;
    if (uVar8 != 0) {
      uVar14 = 0;
      do {
        pvVar13 = (void *)(ulong)uVar18;
        if ((uint)length < uVar18) {
          udata_printError_63(ds,
                              "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n"
                              ,(ulong)(uint)length,uVar14);
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          inData = pvVar13;
          goto LAB_0019f56a;
        }
        pvVar12 = (void *)((long)__src + (long)pvVar13);
        pvVar21 = (void *)((long)__dest + (long)pvVar13);
        puVar16 = (uint16_t *)((long)__src + (long)pvVar13 + 10);
        uVar5 = (*ds->readUInt16)(*puVar16);
        uVar18 = uVar18 + uVar5;
        (*ds->swapArray32)(ds,pvVar12,8,pvVar21,pErrorCode);
        (*ds->swapArray16)(ds,puVar16,2,(void *)((long)__dest + (long)pvVar13 + 10),pErrorCode);
        bVar1 = *(byte *)((long)__src + (long)pvVar13 + 8);
        if (bVar1 == 1) {
          bVar1 = *(byte *)((long)pvVar12 + 9);
          uVar11 = (uint)bVar1 * 2;
          uVar29 = (ulong)uVar11;
          (*ds->swapArray16)(ds,(void *)((long)pvVar12 + 0xc),uVar11,(void *)((long)pvVar21 + 0xc),
                             pErrorCode);
          iVar26 = (uint)uVar5 + (uint)bVar1 * -2;
          uVar23 = (ulong)(iVar26 - 0xc);
          pcVar25 = (char *)((long)inData + (long)pvVar13 + uVar23 + lVar19 + 0xb + uVar29);
          uVar28 = 0;
          do {
            if (uVar23 == uVar28) {
              iVar22 = 0;
              goto LAB_0019f9bc;
            }
            uVar28 = uVar28 + 1;
            cVar2 = *pcVar25;
            pcVar25 = pcVar25 + -1;
          } while (cVar2 != '\0');
          iVar22 = (iVar26 - (int)uVar28) + -0xb;
LAB_0019f9bc:
          (*ds->swapInvChars)(ds,(void *)((long)pvVar12 + uVar29 + 0xc),iVar22,
                              (void *)((long)pvVar21 + uVar29 + 0xc),pErrorCode);
        }
        else {
          if (bVar1 != 0) {
            bVar4 = false;
            udata_printError_63(ds,"uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                                (ulong)bVar1,uVar14);
            *pErrorCode = U_UNSUPPORTED_ERROR;
            goto LAB_0019f56e;
          }
          pUVar3 = ds->swapInvChars;
          sVar17 = strlen((char *)((long)pvVar12 + 0xc));
          (*pUVar3)(ds,(char *)((long)pvVar12 + 0xc),(int32_t)sVar17,(void *)((long)pvVar21 + 0xc),
                    pErrorCode);
          if (U_ZERO_ERROR < *pErrorCode) {
            udata_printError_63(ds,"uchar_swapNames(prefix string of algorithmic range %u) failed\n"
                                ,uVar14);
            inData = (void *)(ulong)uVar18;
            goto LAB_0019f56a;
          }
        }
        uVar11 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar11;
      } while (uVar11 != uVar8);
    }
    bVar4 = true;
  }
  else {
LAB_0019f56a:
    bVar4 = false;
    uVar18 = (uint)inData;
  }
LAB_0019f56e:
  if (!bVar4) {
    return 0;
  }
LAB_0019f5f3:
  return uVar18 + iVar7;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uchar_swapNames(const UDataSwapper *ds,
                const void *inData, int32_t length, void *outData,
                UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    uint32_t tokenStringOffset, groupsOffset, groupStringOffset, algNamesOffset,
             offset, i, count, stringsCount;

    const AlgorithmicRange *inRange;
    AlgorithmicRange *outRange;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x75 &&   /* dataFormat="unam" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x61 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==1
    )) {
        udata_printError(ds, "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;
    if(length<0) {
        algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]);
    } else {
        length-=headerSize;
        if( length<20 ||
            (uint32_t)length<(algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]))
        ) {
            udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    if(length<0) {
        /* preflighting: iterate through algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        offset+=4;

        for(i=0; i<count; ++i) {
            inRange=(const AlgorithmicRange *)(inBytes+offset);
            offset+=ds->readUInt16(inRange->size);
        }
    } else {
        /* swap data */
        const uint16_t *p;
        uint16_t *q, *temp;

        int16_t tokens[512];
        uint16_t tokenCount;

        uint8_t map[256], trailMap[256];

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, length);
        }

        /* the initial 4 offsets first */
        tokenStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[0]);
        groupsOffset=ds->readUInt32(((const uint32_t *)inBytes)[1]);
        groupStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[2]);
        ds->swapArray32(ds, inBytes, 16, outBytes, pErrorCode);

        /*
         * now the tokens table
         * it needs to be permutated along with the compressed name strings
         */
        p=(const uint16_t *)(inBytes+16);
        q=(uint16_t *)(outBytes+16);

        /* read and swap the tokenCount */
        tokenCount=ds->readUInt16(*p);
        ds->swapArray16(ds, p, 2, q, pErrorCode);
        ++p;
        ++q;

        /* read the first 512 tokens and make the token maps */
        if(tokenCount<=512) {
            count=tokenCount;
        } else {
            count=512;
        }
        for(i=0; i<count; ++i) {
            tokens[i]=udata_readInt16(ds, p[i]);
        }
        for(; i<512; ++i) {
            tokens[i]=0; /* fill the rest of the tokens array if tokenCount<512 */
        }
        makeTokenMap(ds, tokens, tokenCount, map, pErrorCode);
        makeTokenMap(ds, tokens+256, (uint16_t)(tokenCount>256 ? tokenCount-256 : 0), trailMap, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }

        /*
         * swap and permutate the tokens
         * go through a temporary array to support in-place swapping
         */
        temp=(uint16_t *)uprv_malloc(tokenCount*2);
        if(temp==NULL) {
            udata_printError(ds, "out of memory swapping %u unames.icu tokens\n",
                             tokenCount);
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }

        /* swap and permutate single-/lead-byte tokens */
        for(i=0; i<tokenCount && i<256; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+map[i], pErrorCode);
        }

        /* swap and permutate trail-byte tokens */
        for(; i<tokenCount; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+(i&0xffffff00)+trailMap[i&0xff], pErrorCode);
        }

        /* copy the result into the output and free the temporary array */
        uprv_memcpy(q, temp, tokenCount*2);
        uprv_free(temp);

        /*
         * swap the token strings but not a possible padding byte after
         * the terminating NUL of the last string
         */
        udata_swapInvStringBlock(ds, inBytes+tokenStringOffset, (int32_t)(groupsOffset-tokenStringOffset),
                                    outBytes+tokenStringOffset, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "uchar_swapNames(token strings) failed\n");
            return 0;
        }

        /* swap the group table */
        count=ds->readUInt16(*((const uint16_t *)(inBytes+groupsOffset)));
        ds->swapArray16(ds, inBytes+groupsOffset, (int32_t)((1+count*3)*2),
                           outBytes+groupsOffset, pErrorCode);

        /*
         * swap the group strings
         * swap the string bytes but not the nibble-encoded string lengths
         */
        if(ds->inCharset!=ds->outCharset) {
            uint16_t offsets[LINES_PER_GROUP+1], lengths[LINES_PER_GROUP+1];

            const uint8_t *inStrings, *nextInStrings;
            uint8_t *outStrings;

            uint8_t c;

            inStrings=inBytes+groupStringOffset;
            outStrings=outBytes+groupStringOffset;

            stringsCount=algNamesOffset-groupStringOffset;

            /* iterate through string groups until only a few padding bytes are left */
            while(stringsCount>32) {
                nextInStrings=expandGroupLengths(inStrings, offsets, lengths);

                /* move past the length bytes */
                stringsCount-=(uint32_t)(nextInStrings-inStrings);
                outStrings+=nextInStrings-inStrings;
                inStrings=nextInStrings;

                count=offsets[31]+lengths[31]; /* total number of string bytes in this group */
                stringsCount-=count;

                /* swap the string bytes using map[] and trailMap[] */
                while(count>0) {
                    c=*inStrings++;
                    *outStrings++=map[c];
                    if(tokens[c]!=-2) {
                        --count;
                    } else {
                        /* token lead byte: swap the trail byte, too */
                        *outStrings++=trailMap[*inStrings++];
                        count-=2;
                    }
                }
            }
        }

        /* swap the algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        ds->swapArray32(ds, inBytes+offset, 4, outBytes+offset, pErrorCode);
        offset+=4;

        for(i=0; i<count; ++i) {
            if(offset>(uint32_t)length) {
                udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n",
                                 length, i);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            inRange=(const AlgorithmicRange *)(inBytes+offset);
            outRange=(AlgorithmicRange *)(outBytes+offset);
            offset+=ds->readUInt16(inRange->size);

            ds->swapArray32(ds, inRange, 8, outRange, pErrorCode);
            ds->swapArray16(ds, &inRange->size, 2, &outRange->size, pErrorCode);
            switch(inRange->type) {
            case 0:
                /* swap prefix string */
                ds->swapInvChars(ds, inRange+1, (int32_t)uprv_strlen((const char *)(inRange+1)),
                                    outRange+1, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "uchar_swapNames(prefix string of algorithmic range %u) failed\n",
                                     i);
                    return 0;
                }
                break;
            case 1:
                {
                    /* swap factors and the prefix and factor strings */
                    uint32_t factorsCount;

                    factorsCount=inRange->variant;
                    p=(const uint16_t *)(inRange+1);
                    q=(uint16_t *)(outRange+1);
                    ds->swapArray16(ds, p, (int32_t)(factorsCount*2), q, pErrorCode);

                    /* swap the strings, up to the last terminating NUL */
                    p+=factorsCount;
                    q+=factorsCount;
                    stringsCount=(uint32_t)((inBytes+offset)-(const uint8_t *)p);
                    while(stringsCount>0 && ((const uint8_t *)p)[stringsCount-1]!=0) {
                        --stringsCount;
                    }
                    ds->swapInvChars(ds, p, (int32_t)stringsCount, q, pErrorCode);
                }
                break;
            default:
                udata_printError(ds, "uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                                 inRange->type, i);
                *pErrorCode=U_UNSUPPORTED_ERROR;
                return 0;
            }
        }
    }

    return headerSize+(int32_t)offset;
}